

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_pipe_ref3(void)

{
  uv_idle_t *handle;
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_handle_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t h;
  undefined1 auStack_480 [8];
  uv_idle_t uStack_478;
  uv_loop_t *puStack_420;
  long lStack_418;
  long lStack_410;
  uv_loop_t *puStack_408;
  char *pcStack_400;
  undefined8 uStack_3f8;
  size_t sStack_3e8;
  uv_process_options_t uStack_3e0;
  uv_process_t auStack_390 [3];
  uv_loop_t *puStack_220;
  undefined1 auStack_1f8 [496];
  
  auStack_1f8._232_8_ = (uv__queue *)0x1b63c7;
  puVar2 = uv_default_loop();
  puVar3 = (uv_loop_t *)(auStack_1f8 + 0x108);
  auStack_1f8._232_8_ = (uv__queue *)0x1b63d9;
  uv_pipe_init(puVar2,(uv_pipe_t *)puVar3,0);
  auStack_1f8._232_8_ = (uv__queue *)0x1b63f6;
  uv_pipe_connect(&connect_req,(uv_pipe_t *)puVar3,"/tmp/uv-test-sock",connect_and_shutdown);
  auStack_1f8._232_8_ = (uv__queue *)0x1b63fe;
  uv_unref((uv_handle_t *)puVar3);
  auStack_1f8._232_8_ = (uv__queue *)0x1b6403;
  puVar2 = uv_default_loop();
  auStack_1f8._232_8_ = (uv__queue *)0x1b640d;
  uv_run(puVar2,UV_RUN_DEFAULT);
  auStack_1f8._256_8_ = (uv_handle_t *)0x1;
  auStack_1f8._248_8_ = SEXT48(connect_cb_called);
  if ((uv_handle_t *)auStack_1f8._248_8_ == (uv_handle_t *)0x1) {
    auStack_1f8._256_8_ = (uv_handle_t *)0x1;
    auStack_1f8._248_8_ = SEXT48(shutdown_cb_called);
    if ((uv_handle_t *)auStack_1f8._248_8_ != (uv_handle_t *)0x1) goto LAB_001b64c8;
    auStack_1f8._232_8_ = (uv__queue *)0x1b645d;
    do_close(auStack_1f8 + 0x108);
    auStack_1f8._232_8_ = (uv__queue *)0x1b6462;
    puVar3 = uv_default_loop();
    auStack_1f8._232_8_ = (uv__queue *)0x1b6476;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    auStack_1f8._232_8_ = (uv__queue *)0x1b6480;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_1f8._256_8_ = (uv_handle_t *)0x0;
    auStack_1f8._232_8_ = (uv__queue *)0x1b648e;
    puVar2 = uv_default_loop();
    auStack_1f8._232_8_ = (uv__queue *)0x1b6496;
    iVar1 = uv_loop_close(puVar2);
    auStack_1f8._248_8_ = SEXT48(iVar1);
    if (auStack_1f8._256_8_ == auStack_1f8._248_8_) {
      auStack_1f8._232_8_ = (uv__queue *)0x1b64ae;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_1f8._232_8_ = (uv__queue *)0x1b64c8;
    run_test_pipe_ref3_cold_1();
LAB_001b64c8:
    auStack_1f8._232_8_ = (uv__queue *)0x1b64d7;
    run_test_pipe_ref3_cold_2();
  }
  auStack_1f8._232_8_ = run_test_pipe_ref4;
  run_test_pipe_ref3_cold_3();
  auStack_1f8._232_8_ = puVar3;
  puVar2 = uv_default_loop();
  puVar3 = (uv_loop_t *)auStack_1f8;
  uv_pipe_init(puVar2,(uv_pipe_t *)puVar3,0);
  uv_pipe_connect(&connect_req,(uv_pipe_t *)puVar3,"/tmp/uv-test-sock",connect_and_write);
  uv_unref((uv_handle_t *)puVar3);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (connect_cb_called == 1) {
    if (write_cb_called != 1) goto LAB_001b661d;
    if (shutdown_cb_called != 1) goto LAB_001b662c;
    do_close(auStack_1f8);
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_pipe_ref4_cold_1();
LAB_001b661d:
    run_test_pipe_ref4_cold_2();
LAB_001b662c:
    run_test_pipe_ref4_cold_3();
  }
  run_test_pipe_ref4_cold_4();
  uStack_3f8 = 0;
  puStack_408 = (uv_loop_t *)0x0;
  pcStack_400 = "spawn_helper4";
  uStack_3e0.env = (char **)0x0;
  uStack_3e0.cwd = (char *)0x0;
  uStack_3e0.flags = 0;
  uStack_3e0.stdio_count = 0;
  uStack_3e0.stdio = (uv_stdio_container_t *)0x0;
  uStack_3e0.uid = 0;
  uStack_3e0.gid = 0;
  uStack_3e0.cpumask = (char *)0x0;
  uStack_3e0.cpumask_size = 0;
  sStack_3e8 = 0x100;
  puVar2 = (uv_loop_t *)(auStack_390 + 1);
  puStack_420 = (uv_loop_t *)0x1b66a5;
  puStack_220 = puVar3;
  iVar1 = uv_exepath((char *)puVar2,&sStack_3e8);
  auStack_390[0].data = (void *)(long)iVar1;
  lStack_418 = 0;
  if (auStack_390[0].data == (void *)0x0) {
    uStack_3e0.args = (char **)&puStack_408;
    uStack_3e0.exit_cb = (uv_exit_cb)0x0;
    puStack_420 = (uv_loop_t *)0x1b66e4;
    puStack_408 = puVar2;
    uStack_3e0.file = (char *)puVar2;
    puVar3 = uv_default_loop();
    puStack_420 = (uv_loop_t *)0x1b66f7;
    iVar1 = uv_spawn(puVar3,auStack_390,&uStack_3e0);
    lStack_418 = (long)iVar1;
    lStack_410 = 0;
    puVar2 = (uv_loop_t *)0x0;
    if (lStack_418 != 0) goto LAB_001b67d4;
    puVar2 = (uv_loop_t *)auStack_390;
    puStack_420 = (uv_loop_t *)0x1b6721;
    uv_unref((uv_handle_t *)puVar2);
    puStack_420 = (uv_loop_t *)0x1b6726;
    puVar3 = uv_default_loop();
    puStack_420 = (uv_loop_t *)0x1b6730;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_420 = (uv_loop_t *)0x1b673d;
    iVar1 = uv_process_kill((uv_process_t *)puVar2,0xf);
    lStack_418 = (long)iVar1;
    lStack_410 = 0;
    if (lStack_418 != 0) goto LAB_001b67e1;
    puStack_420 = (uv_loop_t *)0x1b6768;
    do_close(auStack_390);
    puStack_420 = (uv_loop_t *)0x1b676d;
    puVar2 = uv_default_loop();
    puStack_420 = (uv_loop_t *)0x1b6781;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    puStack_420 = (uv_loop_t *)0x1b678b;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_418 = 0;
    puStack_420 = (uv_loop_t *)0x1b6798;
    puVar3 = uv_default_loop();
    puStack_420 = (uv_loop_t *)0x1b67a0;
    iVar1 = uv_loop_close(puVar3);
    lStack_410 = (long)iVar1;
    if (lStack_418 == lStack_410) {
      puStack_420 = (uv_loop_t *)0x1b67b7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_420 = (uv_loop_t *)0x1b67d4;
    run_test_process_ref_cold_1();
LAB_001b67d4:
    puStack_420 = (uv_loop_t *)0x1b67e1;
    run_test_process_ref_cold_2();
LAB_001b67e1:
    puStack_420 = (uv_loop_t *)0x1b67ee;
    run_test_process_ref_cold_3();
  }
  puStack_420 = (uv_loop_t *)run_test_has_ref;
  run_test_process_ref_cold_4();
  puStack_420 = puVar2;
  puVar3 = uv_default_loop();
  handle = (uv_idle_t *)(auStack_480 + 8);
  uv_idle_init(puVar3,handle);
  uv_ref((uv_handle_t *)handle);
  auStack_480 = (undefined1  [8])0x1;
  iVar1 = uv_has_ref((uv_handle_t *)handle);
  if (auStack_480 == (undefined1  [8])(long)iVar1) {
    uv_unref((uv_handle_t *)(auStack_480 + 8));
    iVar1 = uv_has_ref((uv_handle_t *)(auStack_480 + 8));
    auStack_480 = (undefined1  [8])(long)iVar1;
    if (auStack_480 == (undefined1  [8])0x0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_480 = (undefined1  [8])0x0;
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (auStack_480 == (undefined1  [8])(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b68ed;
    }
  }
  else {
    run_test_has_ref_cold_1();
  }
  run_test_has_ref_cold_2();
LAB_001b68ed:
  handle_00 = (uv_handle_t *)auStack_480;
  run_test_has_ref_cold_3();
  iVar1 = uv_is_closing(handle_00);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle_00,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_ref3) {
  uv_pipe_t h;
  uv_pipe_init(uv_default_loop(), &h, 0);
  uv_pipe_connect(&connect_req, &h, TEST_PIPENAME, connect_and_shutdown);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}